

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O1

void __thiscall AST::IntegerLit::IntegerLit(IntegerLit *this,string *value)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  longlong lVar3;
  undefined8 uVar4;
  char *local_30;
  
  (this->super_Expr).super_Stmt._vptr_Stmt = (_func_int **)&PTR__Stmt_00116be0;
  __nptr = (value->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtoll(__nptr,&local_30,10);
  if (local_30 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stoll");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Unwind_Resume(uVar4);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_0010f5d2;
    lVar3 = std::__throw_out_of_range("stoll");
  }
  *piVar2 = iVar1;
LAB_0010f5d2:
  this->m_value = lVar3;
  return;
}

Assistant:

explicit IntegerLit(const std::string &value) : m_value(std::stoll(value)) { }